

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.h
# Opt level: O0

char * cmTargetPropertyComputer::GetProperty<cmGeneratorTarget>
                 (cmGeneratorTarget *tgt,string *prop,cmMessenger *messenger,
                 cmListFileBacktrace *context)

{
  bool bVar1;
  char *loc;
  cmListFileBacktrace *context_local;
  cmMessenger *messenger_local;
  string *prop_local;
  cmGeneratorTarget *tgt_local;
  
  tgt_local = (cmGeneratorTarget *)GetLocation<cmGeneratorTarget>(tgt,prop,messenger,context);
  if (tgt_local == (cmGeneratorTarget *)0x0) {
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    if (bVar1) {
      tgt_local = (cmGeneratorTarget *)0x0;
    }
    else {
      bVar1 = std::operator==(prop,"SOURCES");
      if (bVar1) {
        tgt_local = (cmGeneratorTarget *)GetSources<cmGeneratorTarget>(tgt,messenger,context);
      }
      else {
        tgt_local = (cmGeneratorTarget *)0x0;
      }
    }
  }
  return (char *)tgt_local;
}

Assistant:

static const char* GetProperty(Target const* tgt, const std::string& prop,
                                 cmMessenger* messenger,
                                 cmListFileBacktrace const& context)
  {
    if (const char* loc = GetLocation(tgt, prop, messenger, context)) {
      return loc;
    }
    if (cmSystemTools::GetFatalErrorOccured()) {
      return CM_NULLPTR;
    }
    if (prop == "SOURCES") {
      return GetSources(tgt, messenger, context);
    }
    return CM_NULLPTR;
  }